

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

Precision * __thiscall
icu_63::number::Precision::withCurrency
          (Precision *__return_storage_ptr__,Precision *this,CurrencyUnit *currency,
          UErrorCode *status)

{
  undefined4 uVar1;
  Precision local_78;
  Precision local_58;
  int32_t local_34;
  double dStack_30;
  int32_t minMaxFrac;
  double increment;
  char16_t *isoCode;
  UErrorCode *status_local;
  CurrencyUnit *currency_local;
  Precision *this_local;
  
  if (this->fType == RND_ERROR) {
    uVar1 = *(undefined4 *)&this->field_0x4;
    __return_storage_ptr__->fType = this->fType;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar1;
    (__return_storage_ptr__->fUnion).fracSig = (this->fUnion).fracSig;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) =
         *(undefined8 *)((long)&this->fUnion + 8);
    uVar1 = *(undefined4 *)&this->field_0x1c;
    __return_storage_ptr__->fRoundingMode = this->fRoundingMode;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
  }
  else {
    isoCode = (char16_t *)status;
    status_local = (UErrorCode *)currency;
    currency_local = (CurrencyUnit *)this;
    increment = (double)CurrencyUnit::getISOCurrency(currency);
    dStack_30 = ucurr_getRoundingIncrementForUsage_63
                          ((UChar *)increment,(this->fUnion).currencyUsage,(UErrorCode *)isoCode);
    local_34 = ucurr_getDefaultFractionDigitsForUsage_63
                         ((UChar *)increment,(this->fUnion).currencyUsage,(UErrorCode *)isoCode);
    if ((dStack_30 != 0.0) || (NAN(dStack_30))) {
      constructIncrement((IncrementPrecision *)&local_58,dStack_30,local_34);
      __return_storage_ptr__->fType = local_58.fType;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_58._4_4_;
      (__return_storage_ptr__->fUnion).fracSig = local_58.fUnion.fracSig;
      *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_58.fUnion._8_8_;
      __return_storage_ptr__->fRoundingMode = local_58.fRoundingMode;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_58._28_4_;
    }
    else {
      constructFraction((FractionPrecision *)&local_78,local_34,local_34);
      __return_storage_ptr__->fType = local_78.fType;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_78._4_4_;
      (__return_storage_ptr__->fUnion).fracSig = local_78.fUnion.fracSig;
      *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_78.fUnion._8_8_;
      __return_storage_ptr__->fRoundingMode = local_78.fRoundingMode;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_78._28_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Precision Precision::withCurrency(const CurrencyUnit &currency, UErrorCode &status) const {
    if (fType == RND_ERROR) { return *this; } // no-op in error state
    U_ASSERT(fType == RND_CURRENCY);
    const char16_t *isoCode = currency.getISOCurrency();
    double increment = ucurr_getRoundingIncrementForUsage(isoCode, fUnion.currencyUsage, &status);
    int32_t minMaxFrac = ucurr_getDefaultFractionDigitsForUsage(
            isoCode, fUnion.currencyUsage, &status);
    if (increment != 0.0) {
        return constructIncrement(increment, minMaxFrac);
    } else {
        return constructFraction(minMaxFrac, minMaxFrac);
    }
}